

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateDefaultGlobalTargets(cmGlobalGenerator *this,cmTargets *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar7;
  string *psVar8;
  size_t sVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  mapped_type *pmVar10;
  undefined4 extraout_var_05;
  char *__s;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Alloc_hider _Var11;
  cmCustomCommandLine singleLine;
  key_type local_668;
  key_type local_648;
  cmCustomCommandLines cpackCommandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  key_type local_5f0;
  allocator local_5ca;
  allocator local_5c9;
  string cfgArg;
  cmCustomCommandLine localCmdLine;
  string configFile;
  string relConfigFile;
  cmCustomCommandLine stripCmdLine;
  string local_2d8;
  string workingDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  string edit_cmd;
  ios_base local_138 [264];
  char *pcVar6;
  
  this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar5 = (*this->_vptr_cmGlobalGenerator[0xd])();
  pcVar6 = (char *)CONCAT44(extraout_var,iVar5);
  pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&workingDir,pcVar7,(allocator *)&cfgArg);
  cpackCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cpackCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cpackCommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  singleLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar8 = cmSystemTools::GetCPackCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar8);
  if (((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) && (*pcVar6 != '.')) {
    paVar1 = &cfgArg.field_2;
    cfgArg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-C","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != paVar1) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    cfgArg._M_dataplus._M_p = (pointer)paVar1;
    sVar9 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,pcVar6,pcVar6 + sVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != paVar1) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
  }
  cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"--config","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
             &cfgArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
    operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  std::__cxx11::string::string((string *)&configFile,pcVar7,(allocator *)&cfgArg);
  std::__cxx11::string::append((char *)&configFile);
  relConfigFile._M_dataplus._M_p = (pointer)&relConfigFile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&relConfigFile,"./CPackConfig.cmake","")
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&relConfigFile);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&cpackCommandLines.
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,&singleLine);
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
  if (CONCAT44(extraout_var_00,iVar5) == 0) {
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cfgArg,"CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY","");
    pcVar7 = cmMakefile::GetDefinition(this_00,&cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    if ((pcVar7 == (char *)0x0) || (bVar4 = cmSystemTools::IsOff(pcVar7), bVar4)) {
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x11])(this);
      std::__cxx11::string::string
                ((string *)&cfgArg,(char *)CONCAT44(extraout_var_02,iVar5),(allocator *)&edit_cmd);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &cfgArg);
      goto LAB_00304609;
    }
  }
  else {
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
    std::__cxx11::string::string
              ((string *)&cfgArg,(char *)CONCAT44(extraout_var_01,iVar5),(allocator *)&edit_cmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&cfgArg
              );
LAB_00304609:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmsys::SystemTools::FileExists(configFile._M_dataplus._M_p);
  if (bVar4) {
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    std::__cxx11::string::string
              ((string *)&edit_cmd,(char *)CONCAT44(extraout_var_03,iVar5),(allocator *)&local_648);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c0,&depends);
    CreateGlobalTarget((cmTarget *)&cfgArg,this,&edit_cmd,"Run CPack packaging tool...",
                       &cpackCommandLines,&local_1c0,workingDir._M_dataplus._M_p,true);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
    std::__cxx11::string::string
              ((string *)&local_668,(char *)CONCAT44(extraout_var_04,iVar5),(allocator *)&local_5f0)
    ;
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)targets,&local_668);
    cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
    cmTarget::~cmTarget((cmTarget *)&cfgArg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)edit_cmd._M_dataplus._M_p != &edit_cmd.field_2) {
      operator_delete(edit_cmd._M_dataplus._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x18])(this);
  pcVar7 = (char *)CONCAT44(extraout_var_05,iVar5);
  if (pcVar7 != (char *)0x0) {
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(iterator)
                singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&depends,(iterator)
                        depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    psVar8 = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,psVar8);
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"--config","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    __s = cmMakefile::GetCurrentBinaryDirectory(this_00);
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&configFile,0,(char *)configFile._M_string_length,(ulong)__s);
    std::__cxx11::string::append((char *)&configFile);
    std::__cxx11::string::_M_replace
              ((ulong)&relConfigFile,0,(char *)relConfigFile._M_string_length,0x5a8c13);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&relConfigFile);
    bVar4 = cmsys::SystemTools::FileExists(configFile._M_dataplus._M_p);
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&configFile);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &singleLine);
      edit_cmd._M_dataplus._M_p = (pointer)&edit_cmd.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&edit_cmd,pcVar7,pcVar7 + sVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1d8,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&edit_cmd,"Run CPack packaging tool for source..."
                         ,&cpackCommandLines,&local_1d8,workingDir._M_dataplus._M_p,true);
      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,pcVar7,pcVar7 + sVar9);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,&local_668);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668._M_dataplus._M_p != &local_668.field_2) {
        operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)edit_cmd._M_dataplus._M_p != &edit_cmd.field_2) {
        operator_delete(edit_cmd._M_dataplus._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
      }
    }
  }
  cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"CMAKE_TESTING_ENABLED","");
  bVar4 = cmMakefile::IsOn(this_00,&cfgArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
    operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(iterator)
                singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&depends,(iterator)
                        depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    psVar8 = cmSystemTools::GetCTestCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,psVar8);
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cfgArg,"--force-new-ctest-process","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    if (((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) || (*pcVar6 == '.')) {
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"$(ARGS)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
    }
    else {
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-C","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      sVar9 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,pcVar6,pcVar6 + sVar9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,&singleLine)
    ;
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x16])(this);
    std::__cxx11::string::string
              ((string *)&edit_cmd,(char *)CONCAT44(extraout_var_06,iVar5),(allocator *)&local_648);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1f0,&depends);
    CreateGlobalTarget((cmTarget *)&cfgArg,this,&edit_cmd,"Running tests...",&cpackCommandLines,
                       &local_1f0,(char *)0x0,true);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x16])(this);
    std::__cxx11::string::string
              ((string *)&local_668,(char *)CONCAT44(extraout_var_07,iVar5),(allocator *)&local_5f0)
    ;
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)targets,&local_668);
    cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
    cmTarget::~cmTarget((cmTarget *)&cfgArg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)edit_cmd._M_dataplus._M_p != &edit_cmd.field_2) {
      operator_delete(edit_cmd._M_dataplus._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x19])(this);
  pcVar7 = (char *)CONCAT44(extraout_var_08,iVar5);
  if (pcVar7 != (char *)0x0) {
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(iterator)
                singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&depends,(iterator)
                        depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    (*this->_vptr_cmGlobalGenerator[0x1c])(&edit_cmd,this);
    if (edit_cmd._M_string_length == 0) {
      psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,psVar8);
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-E","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"echo","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cfgArg,"No interactive CMake dialog available.","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &singleLine);
      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,pcVar7,pcVar7 + sVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_220,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_668,
                         "No interactive CMake dialog available...",&cpackCommandLines,&local_220,
                         (char *)0x0,false);
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,pcVar7,pcVar7 + sVar9);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,&local_648);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      this_01 = &local_220;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&edit_cmd);
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-H$(CMAKE_SOURCE_DIR)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-B$(CMAKE_BINARY_DIR)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &singleLine);
      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,pcVar7,pcVar7 + sVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_208,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_668,"Running CMake cache editor...",
                         &cpackCommandLines,&local_208,(char *)0x0,true);
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      sVar9 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,pcVar7,pcVar7 + sVar9);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,&local_648);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      this_01 = &local_208;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)edit_cmd._M_dataplus._M_p != &edit_cmd.field_2) {
      operator_delete(edit_cmd._M_dataplus._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (*this->_vptr_cmGlobalGenerator[0x1a])(this);
  pcVar7 = (char *)CONCAT44(extraout_var_09,iVar5);
  if (pcVar7 != (char *)0x0) {
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(iterator)
                singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&depends,(iterator)
                        depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,psVar8);
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-H$(CMAKE_SOURCE_DIR)","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-B$(CMAKE_BINARY_DIR)","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,&singleLine)
    ;
    edit_cmd._M_dataplus._M_p = (pointer)&edit_cmd.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&edit_cmd,pcVar7,pcVar7 + sVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_238,&depends);
    CreateGlobalTarget((cmTarget *)&cfgArg,this,&edit_cmd,
                       "Running CMake to regenerate build system...",&cpackCommandLines,&local_238,
                       (char *)0x0,true);
    local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,pcVar7,pcVar7 + sVar9);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)targets,&local_668);
    cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
    }
    cmTarget::~cmTarget((cmTarget *)&cfgArg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)edit_cmd._M_dataplus._M_p != &edit_cmd.field_2) {
      operator_delete(edit_cmd._M_dataplus._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
    }
  }
  cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"CMAKE_SKIP_INSTALL_RULES","");
  bVar4 = cmMakefile::IsOn(this_00,&cfgArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
    operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4 & this->InstallTargetEnabled) == 1) {
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cfgArg,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&cfgArg,false);
    edit_cmd.field_2._M_allocated_capacity = cfgArg.field_2._M_allocated_capacity;
    _Var11 = cfgArg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p == &cfgArg.field_2) goto LAB_0030606b;
  }
  else {
    if (bVar4 || this->InstallTargetEnabled != true) goto LAB_0030606b;
    if (((pcVar6 == (char *)0x0) || (*pcVar6 == '.')) || (*pcVar6 == '\0')) {
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&depends,(iterator)
                          depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                 (iterator)
                 depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&edit_cmd);
      if ((this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&edit_cmd,"Only default component available",0x20);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&edit_cmd,"Available install components are: ",0x22);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8," ","");
        cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                  (&cfgArg,'\"',&this->InstallComponents,'\"',&local_2d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&edit_cmd,cfgArg._M_dataplus._M_p,cfgArg._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
          operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
                 &cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_668,"list_install_components","");
      std::__cxx11::stringbuf::str();
      _Var11._M_p = local_648._M_dataplus._M_p;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_250,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_668,_Var11._M_p,&cpackCommandLines,
                         &local_250,(char *)0x0,false);
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_5f0,"list_install_components","");
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,&local_5f0);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668._M_dataplus._M_p != &local_668.field_2) {
        operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&edit_cmd);
      std::ios_base::~ios_base(local_138);
    }
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    edit_cmd._M_dataplus._M_p = (pointer)&edit_cmd.field_2;
    pcVar2 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&edit_cmd,pcVar2,pcVar2 + psVar8->_M_string_length);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start,
               (iterator)
               cpackCommandLines.
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,(iterator)
                singleLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               singleLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&depends,(iterator)
                        depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               (iterator)
               depends.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
    if (CONCAT44(extraout_var_10,iVar5) == 0) {
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cfgArg,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
      pcVar7 = cmMakefile::GetDefinition(this_00,&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar7 == (char *)0x0) || (bVar4 = cmSystemTools::IsOff(pcVar7), bVar4)) {
        iVar5 = (*this->_vptr_cmGlobalGenerator[0x11])(this);
        std::__cxx11::string::string
                  ((string *)&cfgArg,(char *)CONCAT44(extraout_var_12,iVar5),(allocator *)&local_668
                  );
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &cfgArg);
        goto LAB_00305850;
      }
    }
    else {
      iVar5 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
      std::__cxx11::string::string
                ((string *)&cfgArg,(char *)CONCAT44(extraout_var_11,iVar5),(allocator *)&local_668);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &cfgArg);
LAB_00305850:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
    }
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"CMake_BINARY_DIR","");
    pcVar7 = cmMakefile::GetDefinition(this_00,&cfgArg);
    if (pcVar7 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_668,"CMAKE_CROSSCOMPILING","");
      bVar4 = cmMakefile::IsOn(this_00,&local_668);
      bVar4 = !bVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668._M_dataplus._M_p != &local_668.field_2) {
        operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      std::__cxx11::string::_M_replace
                ((ulong)&edit_cmd,0,(char *)edit_cmd._M_string_length,0x5c2c85);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,&edit_cmd);
    if (((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) && (*pcVar6 != '.')) {
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-DBUILD_TYPE=","");
      bVar4 = cmMakefile::PlatformIsAppleIos(this_00);
      if (bVar4) {
        std::__cxx11::string::append((char *)&cfgArg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&singleLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,&cfgArg);
        std::__cxx11::string::_M_replace((ulong)&cfgArg,0,(char *)cfgArg._M_string_length,0x5a8e53);
      }
      else {
        local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"CMAKE_CFG_INTDIR","");
        cmMakefile::GetDefinition(this_00,&local_648);
        std::__cxx11::string::append((char *)&cfgArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_648._M_dataplus._M_p != &local_648.field_2) {
          operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&singleLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ,&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
    }
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"-P","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cfgArg,"cmake_install.cmake","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&singleLine,
               &cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
      operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&cpackCommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,&singleLine)
    ;
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x12])(this);
    std::__cxx11::string::string
              ((string *)&local_648,(char *)CONCAT44(extraout_var_13,iVar5),
               (allocator *)&localCmdLine);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_268,&depends);
    CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_648,"Install the project...",
                       &cpackCommandLines,&local_268,(char *)0x0,true);
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x12])(this);
    std::__cxx11::string::string
              ((string *)&local_5f0,(char *)CONCAT44(extraout_var_14,iVar5),
               (allocator *)&stripCmdLine);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)targets,&local_5f0);
    cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    cmTarget::~cmTarget((cmTarget *)&cfgArg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x13])(this);
    pcVar6 = (char *)CONCAT44(extraout_var_15,iVar5);
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&localCmdLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      pbVar3 = localCmdLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cfgArg,"-DCMAKE_INSTALL_LOCAL_ONLY=1","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&localCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,pbVar3 + 1,&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &localCmdLine);
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      sVar9 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,pcVar6,pcVar6 + sVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_280,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_648,
                         "Installing only the local directory...",&cpackCommandLines,&local_280,
                         (char *)0x0,true);
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      sVar9 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,pcVar6,pcVar6 + sVar9);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,&local_5f0);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_280);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&localCmdLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
    iVar5 = (*this->_vptr_cmGlobalGenerator[0x14])(this);
    pcVar6 = (char *)CONCAT44(extraout_var_16,iVar5);
    if (pcVar6 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"CMAKE_STRIP","");
      bVar4 = cmMakefile::IsSet(this_00,&local_648);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4 != false) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&stripCmdLine.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ,&singleLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      cfgArg._M_dataplus._M_p = (pointer)&cfgArg.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cfgArg,"-DCMAKE_INSTALL_DO_STRIP=1","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&stripCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,stripCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,&cfgArg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cfgArg._M_dataplus._M_p != &cfgArg.field_2) {
        operator_delete(cfgArg._M_dataplus._M_p,cfgArg.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::_M_erase
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (iterator)
                 cpackCommandLines.
                 super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&cpackCommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 &stripCmdLine);
      std::__cxx11::string::string((string *)&local_5f0,pcVar6,&local_5c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_298,&depends);
      CreateGlobalTarget((cmTarget *)&cfgArg,this,&local_5f0,"Installing the project stripped...",
                         &cpackCommandLines,&local_298,(char *)0x0,true);
      std::__cxx11::string::string((string *)&localCmdLine,pcVar6,&local_5ca);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)targets,(key_type *)&localCmdLine);
      cmTarget::operator=(pmVar10,(cmTarget *)&cfgArg);
      if (localCmdLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&localCmdLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(localCmdLine.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((localCmdLine.
                                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      cmTarget::~cmTarget((cmTarget *)&cfgArg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&stripCmdLine.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    }
    _Var11._M_p = edit_cmd._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)edit_cmd._M_dataplus._M_p == &edit_cmd.field_2) goto LAB_0030606b;
  }
  operator_delete(_Var11._M_p,edit_cmd.field_2._M_allocated_capacity + 1);
LAB_0030606b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)relConfigFile._M_dataplus._M_p != &relConfigFile.field_2) {
    operator_delete(relConfigFile._M_dataplus._M_p,relConfigFile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configFile._M_dataplus._M_p != &configFile.field_2) {
    operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&singleLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&cpackCommandLines.
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)workingDir._M_dataplus._M_p != &workingDir.field_2) {
    operator_delete(workingDir._M_dataplus._M_p,workingDir.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateDefaultGlobalTargets(cmTargets* targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();

  // CPack
  std::string workingDir =  mf->GetCurrentBinaryDirectory();
  cmCustomCommandLines cpackCommandLines;
  std::vector<std::string> depends;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  if ( cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.' )
    {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
    }
  singleLine.push_back("--config");
  std::string configFile = mf->GetCurrentBinaryDirectory();;
  configFile += "/CPackConfig.cmake";
  std::string relConfigFile = "./CPackConfig.cmake";
  singleLine.push_back(relConfigFile);
  cpackCommandLines.push_back(singleLine);
  if ( this->GetPreinstallTargetName() )
    {
    depends.push_back(this->GetPreinstallTargetName());
    }
  else
    {
    const char* noPackageAll =
      mf->GetDefinition("CMAKE_SKIP_PACKAGE_ALL_DEPENDENCY");
    if(!noPackageAll || cmSystemTools::IsOff(noPackageAll))
      {
      depends.push_back(this->GetAllTargetName());
      }
    }
  if(cmSystemTools::FileExists(configFile.c_str()))
    {
    (*targets)[this->GetPackageTargetName()]
      = this->CreateGlobalTarget(this->GetPackageTargetName(),
                                 "Run CPack packaging tool...",
                                 &cpackCommandLines, depends,
                                 workingDir.c_str(), /*uses_terminal*/true);
    }
  // CPack source
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if ( packageSourceTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCPackCommand());
    singleLine.push_back("--config");
    configFile = mf->GetCurrentBinaryDirectory();;
    configFile += "/CPackSourceConfig.cmake";
    relConfigFile = "./CPackSourceConfig.cmake";
    singleLine.push_back(relConfigFile);
    if(cmSystemTools::FileExists(configFile.c_str()))
      {
      singleLine.push_back(configFile);
      cpackCommandLines.push_back(singleLine);
      (*targets)[packageSourceTargetName]
        = this->CreateGlobalTarget(packageSourceTargetName,
                                   "Run CPack packaging tool for source...",
                                   &cpackCommandLines, depends,
                                   workingDir.c_str(), /*uses_terminal*/true);
      }
    }

  // Test
  if(mf->IsOn("CMAKE_TESTING_ENABLED"))
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCTestCommand());
    singleLine.push_back("--force-new-ctest-process");
    if(cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.')
      {
      singleLine.push_back("-C");
      singleLine.push_back(cmakeCfgIntDir);
      }
    else // TODO: This is a hack. Should be something to do with the generator
      {
      singleLine.push_back("$(ARGS)");
      }
    cpackCommandLines.push_back(singleLine);
    (*targets)[this->GetTestTargetName()]
      = this->CreateGlobalTarget(this->GetTestTargetName(),
        "Running tests...", &cpackCommandLines, depends, 0,
        /*uses_terminal*/true);
    }

  //Edit Cache
  const char* editCacheTargetName = this->GetEditCacheTargetName();
  if ( editCacheTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());

    // Use generator preference for the edit_cache rule if it is defined.
    std::string edit_cmd = this->GetEditCacheCommand();
    if (!edit_cmd.empty())
      {
      singleLine.push_back(edit_cmd);
      singleLine.push_back("-H$(CMAKE_SOURCE_DIR)");
      singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
      cpackCommandLines.push_back(singleLine);
      (*targets)[editCacheTargetName] =
        this->CreateGlobalTarget(
          editCacheTargetName, "Running CMake cache editor...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }
    else
      {
      singleLine.push_back(cmSystemTools::GetCMakeCommand());
      singleLine.push_back("-E");
      singleLine.push_back("echo");
      singleLine.push_back("No interactive CMake dialog available.");
      cpackCommandLines.push_back(singleLine);
      (*targets)[editCacheTargetName] =
        this->CreateGlobalTarget(
          editCacheTargetName,
          "No interactive CMake dialog available...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/false);
      }
    }

  //Rebuild Cache
  const char* rebuildCacheTargetName = this->GetRebuildCacheTargetName();
  if ( rebuildCacheTargetName )
    {
    cpackCommandLines.erase(cpackCommandLines.begin(),
                            cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    singleLine.push_back(cmSystemTools::GetCMakeCommand());
    singleLine.push_back("-H$(CMAKE_SOURCE_DIR)");
    singleLine.push_back("-B$(CMAKE_BINARY_DIR)");
    cpackCommandLines.push_back(singleLine);
    (*targets)[rebuildCacheTargetName] =
      this->CreateGlobalTarget(
        rebuildCacheTargetName, "Running CMake to regenerate build system...",
        &cpackCommandLines, depends, 0, /*uses_terminal*/true);
    }

  //Install
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if(this->InstallTargetEnabled && skipInstallRules)
    {
    mf->IssueMessage(cmake::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified");
    }
  else if(this->InstallTargetEnabled && !skipInstallRules)
    {
    if(!cmakeCfgIntDir || !*cmakeCfgIntDir || cmakeCfgIntDir[0] == '.')
      {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      cpackCommandLines.erase(cpackCommandLines.begin(),
        cpackCommandLines.end());
      depends.erase(depends.begin(), depends.end());
      std::ostringstream ostr;
      if (!componentsSet->empty())
        {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
        }
      else
        {
        ostr << "Only default component available";
        }
      singleLine.push_back(ostr.str());
      (*targets)["list_install_components"]
        = this->CreateGlobalTarget("list_install_components",
          ostr.str().c_str(),
          &cpackCommandLines, depends, 0, /*uses_terminal*/false);
      }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    cpackCommandLines.erase(cpackCommandLines.begin(),
      cpackCommandLines.end());
    singleLine.erase(singleLine.begin(), singleLine.end());
    depends.erase(depends.begin(), depends.end());
    if ( this->GetPreinstallTargetName() )
      {
      depends.push_back(this->GetPreinstallTargetName());
      }
    else
      {
      const char* noall =
        mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if(!noall || cmSystemTools::IsOff(noall))
        {
        depends.push_back(this->GetAllTargetName());
        }
      }
    if(mf->GetDefinition("CMake_BINARY_DIR") &&
       !mf->IsOn("CMAKE_CROSSCOMPILING"))
      {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
      }
    singleLine.push_back(cmd);
    if ( cmakeCfgIntDir && *cmakeCfgIntDir && cmakeCfgIntDir[0] != '.' )
      {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool iosPlatform = mf->PlatformIsAppleIos();
      if(iosPlatform)
        {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
        }
      else
        {
        cfgArg += mf->GetDefinition("CMAKE_CFG_INTDIR");
        }
      singleLine.push_back(cfgArg);
      }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    cpackCommandLines.push_back(singleLine);
    (*targets)[this->GetInstallTargetName()] =
      this->CreateGlobalTarget(
        this->GetInstallTargetName(), "Install the project...",
        &cpackCommandLines, depends, 0, /*uses_terminal*/true);

    // install_local
    if(const char* install_local = this->GetInstallLocalTargetName())
      {
      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin()+1,
                                               "-DCMAKE_INSTALL_LOCAL_ONLY=1");
      cpackCommandLines.erase(cpackCommandLines.begin(),
                                                      cpackCommandLines.end());
      cpackCommandLines.push_back(localCmdLine);

      (*targets)[install_local] =
        this->CreateGlobalTarget(
          install_local, "Installing only the local directory...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if((install_strip !=0) && (mf->IsSet("CMAKE_STRIP")))
      {
      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin()+1,"-DCMAKE_INSTALL_DO_STRIP=1");
      cpackCommandLines.erase(cpackCommandLines.begin(),
        cpackCommandLines.end());
      cpackCommandLines.push_back(stripCmdLine);

      (*targets)[install_strip] =
        this->CreateGlobalTarget(
          install_strip, "Installing the project stripped...",
          &cpackCommandLines, depends, 0, /*uses_terminal*/true);
      }
    }
}